

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  bool bVar1;
  size_t sVar2;
  char *d;
  undefined8 *in_RSI;
  Slice *in_RDI;
  uint32_t len;
  Slice local_30;
  uint local_1c;
  undefined8 *local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_18 = in_RSI;
  bVar1 = GetVarint32((Slice *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                      (uint32_t *)in_RDI);
  if ((bVar1) && (sVar2 = Slice::size(in_RDI), local_1c <= sVar2)) {
    d = Slice::data(in_RDI);
    Slice::Slice(&local_30,d,(ulong)local_1c);
    *local_18 = local_30.data_;
    local_18[1] = local_30.size_;
    Slice::remove_prefix(in_RDI,(ulong)local_1c);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}